

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::DockNodeUpdateHasCentralNodeChild(ImGuiDockNode *node)

{
  bool bVar1;
  ImGuiDockNode *local_18;
  ImGuiDockNode *mark_node;
  ImGuiDockNode *node_local;
  
  *(ushort *)&node->field_0xbc = *(ushort *)&node->field_0xbc & 0xdfff;
  if (node->ChildNodes[0] != (ImGuiDockNode *)0x0) {
    DockNodeUpdateHasCentralNodeChild(node->ChildNodes[0]);
  }
  if (node->ChildNodes[1] != (ImGuiDockNode *)0x0) {
    DockNodeUpdateHasCentralNodeChild(node->ChildNodes[1]);
  }
  bVar1 = ImGuiDockNode::IsRootNode(node);
  if (bVar1) {
    for (local_18 = node->CentralNode; local_18 != (ImGuiDockNode *)0x0;
        local_18 = local_18->ParentNode) {
      *(ushort *)&local_18->field_0xbc = *(ushort *)&local_18->field_0xbc & 0xdfff | 0x2000;
    }
  }
  return;
}

Assistant:

static void ImGui::DockNodeUpdateHasCentralNodeChild(ImGuiDockNode* node)
{
    node->HasCentralNodeChild = false;
    if (node->ChildNodes[0])
        DockNodeUpdateHasCentralNodeChild(node->ChildNodes[0]);
    if (node->ChildNodes[1])
        DockNodeUpdateHasCentralNodeChild(node->ChildNodes[1]);
    if (node->IsRootNode())
    {
        ImGuiDockNode* mark_node = node->CentralNode;
        while (mark_node)
        {
            mark_node->HasCentralNodeChild = true;
            mark_node = mark_node->ParentNode;
        }
    }
}